

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void __thiscall
CRenderTools::RenderTee
          (CRenderTools *this,CAnimState *pAnim,CTeeRenderInfo *pInfo,int Emote,vec2 Dir,vec2 Pos)

{
  float w_00;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  CAnimKeyframe *pCVar4;
  IGraphics *pIVar5;
  int in_ECX;
  uint *in_RDX;
  CAnimState *in_RSI;
  CRenderTools *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  float fVar7;
  float fVar8;
  undefined8 in_XMM0_Qa;
  vector2_base<float> vVar9;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  float cs;
  bool Indicate;
  float h;
  float w;
  CAnimKeyframe *pFoot;
  int Flag;
  vec2 Offset;
  float h_1;
  float EyeScale;
  int t;
  vec2 BodyPos;
  float BaseSize;
  float AnimScale;
  int f;
  bool OutLine;
  int p;
  bool IsBot;
  CQuadItem QuadItem;
  CQuadItem QuadItem_1;
  CQuadItem Item;
  CQuadItem BotItem;
  CQuadItem BodyItem;
  vec2 Position;
  vec2 Direction;
  int in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  int iVar10;
  CAnimKeyframe *in_stack_fffffffffffffe68;
  int iVar11;
  IGraphics *in_stack_fffffffffffffe70;
  float local_174;
  float local_128;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_108;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_104;
  int local_f8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_f4;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_f0;
  int local_e4;
  int local_dc;
  int local_d4;
  CQuadItem local_b4;
  uint local_a4;
  uint local_a0;
  CQuadItem local_9c;
  vector2_base<float> local_8c;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  CQuadItem local_68;
  CQuadItem local_58;
  CQuadItem local_48;
  vector2_base<float> local_38;
  vector2_base<float> local_30;
  undefined8 local_28;
  undefined8 local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_20 = in_XMM0_Qa;
  bVar2 = IGraphics::CTextureHandle::IsValid((CTextureHandle *)0x1d7a4b);
  local_d4 = in_ECX;
  for (local_dc = 0; local_dc < 2; local_dc = local_dc + 1) {
    bVar6 = local_dc != 0;
    for (local_e4 = 0; local_e4 < 2; local_e4 = local_e4 + 1) {
      fVar7 = ((float)in_RDX[0x25] * 1.0) / 64.0;
      w_00 = (float)in_RDX[0x25];
      if (local_e4 == 1) {
        pCVar4 = CAnimState::GetBody(in_RSI);
        fVar8 = pCVar4->m_X;
        pCVar4 = CAnimState::GetBody(in_RSI);
        vector2_base<float>::vector2_base(&local_38,fVar8,pCVar4->m_Y);
        local_30 = vector2_base<float>::operator*
                             ((vector2_base<float> *)in_stack_fffffffffffffe70,
                              (float)((ulong)in_stack_fffffffffffffe68 >> 0x20));
        vVar9 = vector2_base<float>::operator+
                          ((vector2_base<float> *)in_stack_fffffffffffffe70,
                           (vector2_base<float> *)in_stack_fffffffffffffe68);
        local_f4 = vVar9.field_0;
        aStack_f0 = vVar9.field_1;
        IGraphics::CQuadItem::CQuadItem(&local_48,local_f4.x,aStack_f0.y,w_00,w_00);
        IGraphics::CQuadItem::CQuadItem
                  (&local_58,fVar7 * 0.6666667 + local_f4.x,fVar7 * -15.333333 + aStack_f0.y,w_00,
                   w_00);
        IGraphics::CQuadItem::CQuadItem(&local_68);
        if ((bVar2) && (bVar6)) {
          pIVar5 = Graphics(in_RDI);
          local_6c = in_RDX[7];
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_6c);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
          SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,
                       (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (int)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                       in_stack_fffffffffffffe60);
          local_68.m_X = local_58.m_X;
          local_68.m_Y = local_58.m_Y;
          local_68.m_Width = local_58.m_Width;
          local_68.m_Height = local_58.m_Height;
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_68,1);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
        }
        if ((bVar2) && (bVar6)) {
          pIVar5 = Graphics(in_RDI);
          local_70 = in_RDX[7];
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_70);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
          SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,
                       (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (int)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                       in_stack_fffffffffffffe60);
          local_68.m_X = local_58.m_X;
          local_68.m_Y = local_58.m_Y;
          local_68.m_Width = local_58.m_Width;
          local_68.m_Height = local_58.m_Height;
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_68,1);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])
                    ((ulong)in_RDX[9],in_RDX[10],in_RDX[0xb],in_RDX[0xc]);
          SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,
                       (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (int)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                       in_stack_fffffffffffffe60);
          local_68.m_X = local_58.m_X;
          local_68.m_Y = local_58.m_Y;
          local_68.m_Width = local_58.m_Width;
          local_68.m_Height = local_58.m_Height;
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_68,1);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
        }
        bVar3 = IGraphics::CTextureHandle::IsValid((CTextureHandle *)0x1d7eb3);
        if (bVar3) {
          pIVar5 = Graphics(in_RDI);
          local_74 = in_RDX[2];
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_74);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
          pIVar5 = Graphics(in_RDI);
          pCVar4 = CAnimState::GetBody(in_RSI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                    ((ulong)(uint)(pCVar4->m_Angle * 3.1415927 * 2.0));
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])
                    ((ulong)in_RDX[0x15],in_RDX[0x16],in_RDX[0x17],in_RDX[0x18]);
          SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,
                       (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (int)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                       in_stack_fffffffffffffe60);
          local_68.m_X = local_48.m_X;
          local_68.m_Y = local_48.m_Y;
          local_68.m_Width = local_48.m_Width;
          local_68.m_Height = local_48.m_Height;
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_68,1);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
        }
        pIVar5 = Graphics(in_RDI);
        local_78 = *in_RDX;
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_78);
        pIVar5 = Graphics(in_RDI);
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
        pIVar5 = Graphics(in_RDI);
        pCVar4 = CAnimState::GetBody(in_RSI);
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                  ((ulong)(uint)(pCVar4->m_Angle * 3.1415927 * 2.0));
        if (bVar6) {
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])
                    ((ulong)in_RDX[0xd],in_RDX[0xe],in_RDX[0xf],in_RDX[0x10]);
          SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,
                       (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (int)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                       in_stack_fffffffffffffe60);
        }
        else {
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
          SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,
                       (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (int)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                       in_stack_fffffffffffffe60);
        }
        local_68.m_X = local_48.m_X;
        local_68.m_Y = local_48.m_Y;
        local_68.m_Width = local_48.m_Width;
        local_68.m_Height = local_48.m_Height;
        pIVar5 = Graphics(in_RDI);
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_68,1);
        pIVar5 = Graphics(in_RDI);
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
        bVar3 = IGraphics::CTextureHandle::IsValid((CTextureHandle *)0x1d81af);
        if ((bVar3) && (bVar6)) {
          pIVar5 = Graphics(in_RDI);
          local_7c = in_RDX[1];
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_7c);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
          pIVar5 = Graphics(in_RDI);
          pCVar4 = CAnimState::GetBody(in_RSI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                    ((ulong)(uint)(pCVar4->m_Angle * 3.1415927 * 2.0));
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])
                    ((ulong)(uint)((float)in_RDX[0x11] * (float)in_RDX[0x14]),
                     (float)in_RDX[0x12] * (float)in_RDX[0x14],
                     (float)in_RDX[0x13] * (float)in_RDX[0x14],in_RDX[0x14]);
          SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,
                       (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (int)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                       in_stack_fffffffffffffe60);
          local_68.m_X = local_48.m_X;
          local_68.m_Y = local_48.m_Y;
          local_68.m_Width = local_48.m_Width;
          local_68.m_Height = local_48.m_Height;
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_68,1);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
        }
        if (bVar6) {
          pIVar5 = Graphics(in_RDI);
          local_80 = *in_RDX;
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_80);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
          pIVar5 = Graphics(in_RDI);
          pCVar4 = CAnimState::GetBody(in_RSI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                    ((ulong)(uint)(pCVar4->m_Angle * 3.1415927 * 2.0));
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
          for (local_f8 = 0; local_f8 < 2; local_f8 = local_f8 + 1) {
            SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,
                         (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                         (int)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                         in_stack_fffffffffffffe60);
            local_68.m_X = local_48.m_X;
            local_68.m_Y = local_48.m_Y;
            local_68.m_Width = local_48.m_Width;
            local_68.m_Height = local_48.m_Height;
            pIVar5 = Graphics(in_RDI);
            (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_68,1);
          }
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
        }
        pIVar5 = Graphics(in_RDI);
        local_84 = in_RDX[5];
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_84);
        pIVar5 = Graphics(in_RDI);
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
        pIVar5 = Graphics(in_RDI);
        pCVar4 = CAnimState::GetBody(in_RSI);
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                  ((ulong)(uint)(pCVar4->m_Angle * 3.1415927 * 2.0));
        if (bVar2) {
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])
                    ((ulong)in_RDX[9],in_RDX[10],in_RDX[0xb],in_RDX[0xc]);
          local_d4 = 3;
        }
        else {
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])
                    ((ulong)in_RDX[0x21],in_RDX[0x22],in_RDX[0x23],in_RDX[0x24]);
        }
        if (local_dc == 1) {
          iVar10 = (int)in_stack_fffffffffffffe68;
          iVar11 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
          switch(local_d4) {
          case 1:
            SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,iVar11,iVar10,
                         in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
            break;
          case 2:
            SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,iVar11,iVar10,
                         in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
            break;
          case 3:
            SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,iVar11,iVar10,
                         in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
            break;
          case 4:
            SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,iVar11,iVar10,
                         in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
            break;
          default:
            SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,iVar11,iVar10,
                         in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
          }
          local_174 = w_00 * 0.6;
          if (local_d4 == 5) {
            local_174 = w_00 * 0.15;
          }
          local_174 = local_174 / 2.0;
          vector2_base<float>::vector2_base
                    (&local_8c,(float)local_20 * 0.125,local_20._4_4_ * 0.1 + -0.05);
          vVar9 = vector2_base<float>::operator*
                            ((vector2_base<float> *)in_stack_fffffffffffffe70,
                             (float)((ulong)in_stack_fffffffffffffe68 >> 0x20));
          local_108 = vVar9.field_0;
          aStack_104 = vVar9.field_1;
          IGraphics::CQuadItem::CQuadItem
                    (&local_9c,local_f4.x + local_108.x,aStack_f0.y + aStack_104.y,w_00 * 0.6,
                     local_174);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_9c,1);
        }
        pIVar5 = Graphics(in_RDI);
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
        if ((bVar6) &&
           (bVar3 = IGraphics::CTextureHandle::IsValid((CTextureHandle *)0x1d8808), bVar3)) {
          pIVar5 = Graphics(in_RDI);
          local_a0 = in_RDX[6];
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_a0);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
          in_stack_fffffffffffffe70 = Graphics(in_RDI);
          pCVar4 = CAnimState::GetBody(in_RSI);
          fVar8 = pCVar4->m_Angle * 3.1415927;
          (*(in_stack_fffffffffffffe70->super_IInterface)._vptr_IInterface[0x19])
                    ((ulong)(uint)(fVar8 + fVar8));
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
          iVar10 = (int)in_stack_fffffffffffffe68;
          iVar11 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
          switch(in_RDX[8]) {
          case 0:
            SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,iVar11,iVar10,
                         in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
            break;
          case 1:
            SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,iVar11,iVar10,
                         in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
            break;
          case 2:
            SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,iVar11,iVar10,
                         in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
            break;
          case 3:
            SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,iVar11,iVar10,
                         in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
          }
          local_68.m_X = local_48.m_X;
          local_68.m_Y = local_48.m_Y;
          local_68.m_Width = local_48.m_Width;
          local_68.m_Height = local_48.m_Height;
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_68,1);
          pIVar5 = Graphics(in_RDI);
          (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
        }
      }
      pIVar5 = Graphics(in_RDI);
      local_a4 = in_RDX[4];
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,(ulong)local_a4);
      pIVar5 = Graphics(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x17])();
      if (local_e4 == 0) {
        pCVar4 = CAnimState::GetBackFoot(in_RSI);
      }
      else {
        pCVar4 = CAnimState::GetFrontFoot(in_RSI);
      }
      in_stack_fffffffffffffe68 = pCVar4;
      pIVar5 = Graphics(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                ((ulong)(uint)(pCVar4->m_Angle * 3.1415927 * 2.0));
      if (bVar6) {
        uVar1 = in_stack_fffffffffffffe64 & 0xffffff;
        if (in_RDX[0x26] == 0) {
          uVar1 = CONCAT13(in_RDI->m_pConfig->m_ClAirjumpindicator != 0,
                           (int3)in_stack_fffffffffffffe64);
        }
        in_stack_fffffffffffffe64 = uVar1;
        local_128 = 1.0;
        if ((char)(in_stack_fffffffffffffe64 >> 0x18) != '\0') {
          local_128 = 0.5;
        }
        pIVar5 = Graphics(in_RDI);
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])
                  ((ulong)(uint)((float)in_RDX[0x1d] * local_128),(float)in_RDX[0x1e] * local_128,
                   (float)in_RDX[0x1f] * local_128,in_RDX[0x20]);
        SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,
                     (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),(int)in_stack_fffffffffffffe68,
                     in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      }
      else {
        pIVar5 = Graphics(in_RDI);
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
        SelectSprite((CRenderTools *)in_stack_fffffffffffffe70,
                     (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),(int)in_stack_fffffffffffffe68,
                     in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      }
      IGraphics::CQuadItem::CQuadItem
                (&local_b4,pCVar4->m_X * fVar7 + (float)local_28,
                 pCVar4->m_Y * fVar7 + local_28._4_4_,w_00 / 2.1,w_00 / 2.1);
      pIVar5 = Graphics(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_b4,1);
      pIVar5 = Graphics(in_RDI);
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x18])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CRenderTools::RenderTee(CAnimState *pAnim, const CTeeRenderInfo *pInfo, int Emote, vec2 Dir, vec2 Pos)
{
	vec2 Direction = Dir;
	vec2 Position = Pos;
	bool IsBot = pInfo->m_BotTexture.IsValid();

	// first pass we draw the outline
	// second pass we draw the filling
	for(int p = 0; p < 2; p++)
	{
		bool OutLine = p==0;

		for(int f = 0; f < 2; f++)
		{
			float AnimScale = pInfo->m_Size * 1.0f/64.0f;
			float BaseSize = pInfo->m_Size;
			if(f == 1)
			{
				vec2 BodyPos = Position + vec2(pAnim->GetBody()->m_X, pAnim->GetBody()->m_Y)*AnimScale;
				IGraphics::CQuadItem BodyItem(BodyPos.x, BodyPos.y, BaseSize, BaseSize);
				IGraphics::CQuadItem BotItem(BodyPos.x+(2.f/3.f)*AnimScale, BodyPos.y+(-16+2.f/3.f)*AnimScale, BaseSize, BaseSize); // x+0.66, y+0.66 to correct some rendering bug
				IGraphics::CQuadItem Item;

				// draw bot visuals (background)
				if(IsBot && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_BotTexture);
					Graphics()->QuadsBegin();
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BOT_BACKGROUND, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw bot visuals (foreground)
				if(IsBot && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_BotTexture);
					Graphics()->QuadsBegin();
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BOT_FOREGROUND, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->SetColor(pInfo->m_BotColor.r, pInfo->m_BotColor.g, pInfo->m_BotColor.b, pInfo->m_BotColor.a);
					SelectSprite(SPRITE_TEE_BOT_GLOW, 0, 0, 0);
					Item = BotItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw decoration
				if(pInfo->m_aTextures[SKINPART_DECORATION].IsValid())
				{
					Graphics()->TextureSet(pInfo->m_aTextures[2]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_DECORATION].r, pInfo->m_aColors[SKINPART_DECORATION].g, pInfo->m_aColors[SKINPART_DECORATION].b, pInfo->m_aColors[SKINPART_DECORATION].a);
					SelectSprite(OutLine?SPRITE_TEE_DECORATION_OUTLINE:SPRITE_TEE_DECORATION, 0, 0, 0);
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw body (behind marking)
				Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_BODY]);
				Graphics()->QuadsBegin();
				Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
				if(OutLine)
				{
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					SelectSprite(SPRITE_TEE_BODY_OUTLINE, 0, 0, 0);
				}
				else
				{
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_BODY].r, pInfo->m_aColors[SKINPART_BODY].g, pInfo->m_aColors[SKINPART_BODY].b, pInfo->m_aColors[SKINPART_BODY].a);
					SelectSprite(SPRITE_TEE_BODY, 0, 0, 0);
				}
				Item = BodyItem;
				Graphics()->QuadsDraw(&Item, 1);
				Graphics()->QuadsEnd();

				// draw marking
				if(pInfo->m_aTextures[SKINPART_MARKING].IsValid() && !OutLine)
				{
					Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_MARKING]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_MARKING].r*pInfo->m_aColors[SKINPART_MARKING].a, pInfo->m_aColors[SKINPART_MARKING].g*pInfo->m_aColors[SKINPART_MARKING].a,
						pInfo->m_aColors[SKINPART_MARKING].b*pInfo->m_aColors[SKINPART_MARKING].a, pInfo->m_aColors[SKINPART_MARKING].a);
					SelectSprite(SPRITE_TEE_MARKING, 0, 0, 0);
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}

				// draw body (in front of marking)
				if(!OutLine)
				{
					Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_BODY]);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					for(int t = 0; t < 2; t++)
					{
						SelectSprite(t==0?SPRITE_TEE_BODY_SHADOW:SPRITE_TEE_BODY_UPPER_OUTLINE, 0, 0, 0);
						Item = BodyItem;
						Graphics()->QuadsDraw(&Item, 1);
					}
					Graphics()->QuadsEnd();
				}

				// draw eyes
				Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_EYES]);
				Graphics()->QuadsBegin();
				Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi*2);
				if(IsBot)
				{
					Graphics()->SetColor(pInfo->m_BotColor.r, pInfo->m_BotColor.g, pInfo->m_BotColor.b, pInfo->m_BotColor.a);
					Emote = EMOTE_SURPRISE;
				}
				else
					Graphics()->SetColor(pInfo->m_aColors[SKINPART_EYES].r, pInfo->m_aColors[SKINPART_EYES].g, pInfo->m_aColors[SKINPART_EYES].b, pInfo->m_aColors[SKINPART_EYES].a);
				if(p == 1)
				{
					switch (Emote)
					{
						case EMOTE_PAIN:
							SelectSprite(SPRITE_TEE_EYES_PAIN, 0, 0, 0);
							break;
						case EMOTE_HAPPY:
							SelectSprite(SPRITE_TEE_EYES_HAPPY, 0, 0, 0);
							break;
						case EMOTE_SURPRISE:
							SelectSprite(SPRITE_TEE_EYES_SURPRISE, 0, 0, 0);
							break;
						case EMOTE_ANGRY:
							SelectSprite(SPRITE_TEE_EYES_ANGRY, 0, 0, 0);
							break;
						default:
							SelectSprite(SPRITE_TEE_EYES_NORMAL, 0, 0, 0);
							break;
					}

					float EyeScale = BaseSize*0.60f;
					float h = Emote == EMOTE_BLINK ? BaseSize*0.15f/2.0f : EyeScale/2.0f;
					vec2 Offset = vec2(Direction.x*0.125f, -0.05f+Direction.y*0.10f)*BaseSize;
					IGraphics::CQuadItem QuadItem(BodyPos.x+Offset.x, BodyPos.y+Offset.y, EyeScale, h);
					Graphics()->QuadsDraw(&QuadItem, 1);
				}
				Graphics()->QuadsEnd();
				
				// draw xmas hat
				if(!OutLine && pInfo->m_HatTexture.IsValid())
				{
					Graphics()->TextureSet(pInfo->m_HatTexture);
					Graphics()->QuadsBegin();
					Graphics()->QuadsSetRotation(pAnim->GetBody()->m_Angle*pi * 2);
					Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
					int Flag = Direction.x < 0.0f ? SPRITE_FLAG_FLIP_X : 0;
					switch(pInfo->m_HatSpriteIndex)
					{
					case 0:
						SelectSprite(SPRITE_TEE_HATS_TOP1, Flag, 0, 0);
						break;
					case 1:
						SelectSprite(SPRITE_TEE_HATS_TOP2, Flag, 0, 0);
						break;
					case 2:
						SelectSprite(SPRITE_TEE_HATS_SIDE1, Flag, 0, 0);
						break;
					case 3:
						SelectSprite(SPRITE_TEE_HATS_SIDE2, Flag, 0, 0);
					}
					Item = BodyItem;
					Graphics()->QuadsDraw(&Item, 1);
					Graphics()->QuadsEnd();
				}
			}

			// draw feet
			Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_FEET]);
			Graphics()->QuadsBegin();
			CAnimKeyframe *pFoot = f ? pAnim->GetFrontFoot() : pAnim->GetBackFoot();

			float w = BaseSize/2.1f;
			float h = w;

			Graphics()->QuadsSetRotation(pFoot->m_Angle*pi*2);

			if(OutLine)
			{
				Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
				SelectSprite(SPRITE_TEE_FOOT_OUTLINE, 0, 0, 0);
			}
			else
			{
				bool Indicate = !pInfo->m_GotAirJump && m_pConfig->m_ClAirjumpindicator;
				float cs = 1.0f; // color scale
				if(Indicate)
					cs = 0.5f;
				Graphics()->SetColor(pInfo->m_aColors[SKINPART_FEET].r*cs, pInfo->m_aColors[SKINPART_FEET].g*cs, pInfo->m_aColors[SKINPART_FEET].b*cs, pInfo->m_aColors[SKINPART_FEET].a);
				SelectSprite(SPRITE_TEE_FOOT, 0, 0, 0);
			}

			IGraphics::CQuadItem QuadItem(Position.x+pFoot->m_X*AnimScale, Position.y+pFoot->m_Y*AnimScale, w, h);
			Graphics()->QuadsDraw(&QuadItem, 1);
			Graphics()->QuadsEnd();
		}
	}
}